

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O3

void __thiscall
nonstd::optional_lite::detail::storage_t<tinyusdz::Reference>::construct_value
          (storage_t<tinyusdz::Reference> *this,value_type *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  double dVar4;
  
  *(storage_t<tinyusdz::Reference> **)this = this + 0x10;
  pcVar2 = (v->asset_path).asset_path_._M_dataplus._M_p;
  paVar1 = &(v->asset_path).asset_path_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&(v->asset_path).asset_path_.field_2 + 8);
    *(size_type *)(this + 0x10) = paVar1->_M_allocated_capacity;
    *(undefined8 *)(this + 0x18) = uVar3;
  }
  else {
    *(pointer *)this = pcVar2;
    *(size_type *)(this + 0x10) = paVar1->_M_allocated_capacity;
  }
  *(size_type *)(this + 8) = (v->asset_path).asset_path_._M_string_length;
  (v->asset_path).asset_path_._M_dataplus._M_p = (pointer)paVar1;
  (v->asset_path).asset_path_._M_string_length = 0;
  (v->asset_path).asset_path_.field_2._M_local_buf[0] = '\0';
  *(storage_t<tinyusdz::Reference> **)(this + 0x20) = this + 0x30;
  pcVar2 = (v->asset_path).resolved_path_._M_dataplus._M_p;
  paVar1 = &(v->asset_path).resolved_path_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&(v->asset_path).resolved_path_.field_2 + 8);
    *(size_type *)(this + 0x30) = paVar1->_M_allocated_capacity;
    *(undefined8 *)(this + 0x38) = uVar3;
  }
  else {
    *(pointer *)(this + 0x20) = pcVar2;
    *(size_type *)(this + 0x30) = paVar1->_M_allocated_capacity;
  }
  *(size_type *)(this + 0x28) = (v->asset_path).resolved_path_._M_string_length;
  (v->asset_path).resolved_path_._M_dataplus._M_p = (pointer)paVar1;
  (v->asset_path).resolved_path_._M_string_length = 0;
  (v->asset_path).resolved_path_.field_2._M_local_buf[0] = '\0';
  tinyusdz::Path::Path((Path *)(this + 0x40),&v->prim_path);
  dVar4 = (v->layerOffset)._scale;
  *(double *)(this + 0x110) = (v->layerOffset)._offset;
  *(double *)(this + 0x118) = dVar4;
  std::_Rb_tree_header::_Rb_tree_header
            ((_Rb_tree_header *)(this + 0x128),&(v->customData)._M_t._M_impl.super__Rb_tree_header);
  return;
}

Assistant:

void construct_value( value_type && v )
    {
        ::new( value_ptr() ) value_type( std::move( v ) );
    }